

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

void __thiscall
slang::SourceSnippet::printTo(SourceSnippet *this,FormatBuffer *out,terminal_color highlightColor)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  char *begin;
  color_type cVar5;
  ulong uVar6;
  FormatBuffer *pFVar7;
  ulong uVar8;
  ulong uVar9;
  pointer ppVar10;
  format_string<std::basic_string_view<char>_&> fmt;
  format_string<std::basic_string_view<char>_&> fmt_00;
  text_style local_78;
  ulong local_60;
  FormatBuffer *local_58;
  SourceSnippet *local_50;
  pointer local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)out,"\n","");
  sVar1 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len;
  if (sVar1 == 0) {
    begin = (this->snippetLine)._M_dataplus._M_p;
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)out,begin,begin + (this->snippetLine)._M_string_length);
  }
  else {
    ppVar10 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.
              data_;
    pcVar2 = (this->snippetLine)._M_dataplus._M_p;
    local_60 = (this->snippetLine)._M_string_length;
    local_48 = ppVar10 + sVar1;
    uVar9 = 0;
    local_58 = out;
    local_50 = this;
    do {
      uVar6 = local_60;
      if (local_60 < uVar9) goto LAB_001b6f25;
      uVar3 = ppVar10->first;
      uVar4 = ppVar10->second;
      uVar8 = uVar3 - uVar9;
      if (local_60 - uVar9 < uVar3 - uVar9) {
        uVar8 = local_60 - uVar9;
      }
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)out,pcVar2 + uVar9,pcVar2 + uVar9 + uVar8);
      cVar5 = local_78.foreground_color;
      local_78.foreground_color._0_4_ = local_78.foreground_color._0_4_ & 0xffffff00;
      local_78.foreground_color.value.rgb_color._1_3_ = cVar5.value._1_3_;
      local_78.foreground_color.value.term_color = 0;
      local_78.background_color.is_rgb = false;
      local_78.background_color.value.term_color = '\0';
      local_78.set_foreground_color = false;
      local_78.set_background_color = false;
      local_78.ems = reverse;
      uVar8 = uVar6 - uVar3;
      uVar9 = uVar3;
      if (uVar6 < uVar3) goto LAB_001b6f25;
      local_40._M_len = uVar8;
      if (uVar4 <= uVar8) {
        local_40._M_len = uVar4;
      }
      local_40._M_str = pcVar2 + uVar3;
      fmt.str.size_ = 2;
      fmt.str.data_ = "{}";
      FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>&>
                (out,&local_78,fmt,&local_40);
      pFVar7 = local_58;
      uVar9 = uVar4 + uVar3;
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != local_48);
    if (local_60 < uVar9) {
LAB_001b6f25:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar9,local_60);
    }
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)local_58,pcVar2 + uVar9,pcVar2 + local_60);
    out = pFVar7;
    this = local_50;
  }
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)out,"\n","");
  local_78.foreground_color = (color_type)((ulong)highlightColor << 0x20);
  local_78.background_color.is_rgb = false;
  local_78.background_color.value.term_color = '\0';
  local_78.ems = ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  local_78.set_foreground_color = true;
  local_78.set_background_color = false;
  local_40._M_str = (this->highlightLine)._M_dataplus._M_p;
  local_40._M_len = (this->highlightLine)._M_string_length;
  fmt_00.str.size_ = 2;
  fmt_00.str.data_ = "{}";
  FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>&>
            (out,&local_78,fmt_00,&local_40);
  return;
}

Assistant:

void printTo(FormatBuffer& out, fmt::terminal_color highlightColor) {
        out.append("\n");

        if (invalidRanges.empty()) {
            out.append(snippetLine);
        }
        else {
            size_t index = 0;
            std::string_view view = snippetLine;
            for (auto [start, count] : invalidRanges) {
                SLANG_ASSERT(start >= index);
                out.append(view.substr(index, start - index));

                out.append(fmt::emphasis::reverse, view.substr(start, count));
                index = start + count;
            }

            out.append(view.substr(index));
        }

        out.append("\n");
        out.append(fg(highlightColor), highlightLine);
    }